

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O0

void __thiscall pbrt::ParallelForLoop1D::~ParallelForLoop1D(ParallelForLoop1D *this)

{
  ParallelJob *in_RDI;
  
  in_RDI->_vptr_ParallelJob = (_func_int **)&PTR__ParallelForLoop1D_0340c1b8;
  std::function<void_(long,_long)>::~function((function<void_(long,_long)> *)0x52a05a);
  ParallelJob::~ParallelJob(in_RDI);
  return;
}

Assistant:

ParallelForLoop1D(int64_t start, int64_t end, int chunkSize,
                      std::function<void(int64_t, int64_t)> func)
        : func(std::move(func)), nextIndex(start), maxIndex(end), chunkSize(chunkSize) {}